

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeArrayConstructor
               (DynamicObject *arrayConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  ScriptContext *this;
  JavascriptLibrary *this_00;
  Type *builtInFuncs;
  Var value;
  JavascriptLibrary *pJVar1;
  DynamicObject **ppDVar2;
  PropertyString *value_00;
  JavascriptFunction **ppJVar3;
  Type *builtinFuncs;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *arrayConstructor_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayConstructor,mode,6,0);
  this = RecyclableObject::GetScriptContext(&arrayConstructor->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&arrayConstructor->super_RecyclableObject);
  builtInFuncs = GetBuiltinFunctions(this_00);
  value = TaggedInt::ToVarUnchecked(1);
  AddMember(this_00,arrayConstructor,0xd1,value,'\x02');
  pJVar1 = ScriptContext::GetLibrary(this);
  ppDVar2 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(pJVar1->super_JavascriptLibraryBase).arrayPrototype);
  AddMember(this_00,arrayConstructor,0x124,*ppDVar2,'\0');
  AddSpeciesAccessorsToLibraryObject
            (this_00,arrayConstructor,
             (FunctionInfo *)Js::JavascriptArray::EntryInfo::GetterSymbolSpecies);
  value_00 = ScriptContext::GetPropertyString(this,0x4f);
  AddMember(this_00,arrayConstructor,0x106,value_00,'\x02');
  ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this_00->isArrayFunction);
  AddMember(this_00,arrayConstructor,0xbe,*ppJVar3);
  AddFunctionToLibraryObject
            (this_00,arrayConstructor,0x95,(FunctionInfo *)Js::JavascriptArray::EntryInfo::From,1,
             '\x06');
  AddFunctionToLibraryObject
            (this_00,arrayConstructor,0x11c,(FunctionInfo *)Js::JavascriptArray::EntryInfo::Of,0,
             '\x06');
  CheckRegisteredBuiltIns(builtInFuncs,this);
  DynamicObject::SetHasNoEnumerableProperties(arrayConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayConstructor(DynamicObject* arrayConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayConstructor, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArray
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = arrayConstructor->GetScriptContext();
        JavascriptLibrary* library = arrayConstructor->GetLibrary();
        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        library->AddMember(arrayConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(arrayConstructor, PropertyIds::prototype, scriptContext->GetLibrary()->arrayPrototype, PropertyNone);
        library->AddSpeciesAccessorsToLibraryObject(arrayConstructor, &JavascriptArray::EntryInfo::GetterSymbolSpecies);
        library->AddMember(arrayConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::Array), PropertyConfigurable);

#ifdef ENABLE_JS_BUILTINS
        library->AddMember(arrayConstructor, PropertyIds::isArray, library->isArrayFunction);
#else
        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::isArray, &JavascriptArray::EntryInfo::IsArray, 1);
#endif

        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::from, &JavascriptArray::EntryInfo::From, 1);
        library->AddFunctionToLibraryObject(arrayConstructor, PropertyIds::of, &JavascriptArray::EntryInfo::Of, 0);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        arrayConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }